

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O2

void redraw_stuff(player *p)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  int16_t iVar5;
  long lVar6;
  
  uVar2 = p->upkeep->redraw;
  if ((uVar2 != 0) && (character_generated)) {
    _Var4 = map_is_visible();
    uVar3 = uVar2 & 0xf00000;
    if (_Var4) {
      uVar3 = uVar2;
    }
    iVar5 = player_resting_count(p);
    if (((iVar5 % 100 == 0) && (p->upkeep->running % 100 == 0)) || ((uVar3 & 0x90000) != 0)) {
      for (lVar6 = 0; lVar6 != 0x19; lVar6 = lVar6 + 1) {
        if ((redraw_events[lVar6].flag & uVar3) != 0) {
          event_signal(redraw_events[lVar6].event);
        }
      }
      if ((uVar3 >> 0x10 & 1) != 0) {
        event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
      }
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 & ~uVar3;
      _Var4 = map_is_visible();
      if (_Var4) {
        event_signal(EVENT_END);
        return;
      }
    }
  }
  return;
}

Assistant:

void redraw_stuff(struct player *p)
{
	size_t i;
	uint32_t redraw = p->upkeep->redraw;

	/* Redraw stuff */
	if (!redraw) return;

	/* Character is not ready yet, no screen updates */
	if (!character_generated) return;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) 
		redraw &= PR_SUBWINDOW;

	/* Hack - rarely update while resting or running, makes it over quicker */
	if (((player_resting_count(p) % 100) || (p->upkeep->running % 100))
		&& !(redraw & (PR_MESSAGE | PR_MAP)))
		return;

	/* For each listed flag, send the appropriate signal to the UI */
	for (i = 0; i < N_ELEMENTS(redraw_events); i++) {
		const struct flag_event_trigger *hnd = &redraw_events[i];

		if (redraw & hnd->flag)
			event_signal(hnd->event);
	}

	/* Then the ones that require parameters to be supplied. */
	if (redraw & PR_MAP) {
		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	p->upkeep->redraw &= ~redraw;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) return;

	/*
	 * Do any plotting, etc. delayed from earlier - this set of updates
	 * is over.
	 */
	event_signal(EVENT_END);
}